

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMiIntersectorKPluecker<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  long lVar1;
  undefined4 uVar2;
  uint uVar3;
  Scene *pSVar4;
  float **ppfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 (*pauVar38) [16];
  int iVar39;
  uint uVar40;
  undefined1 (*pauVar41) [16];
  long lVar42;
  long lVar43;
  ulong uVar44;
  uint uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 auVar56 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar57 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar71 [16];
  undefined1 auVar70 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  float fVar88;
  float fVar93;
  undefined1 auVar89 [16];
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  float fVar101;
  undefined1 auVar102 [32];
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 auVar103 [64];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [64];
  float fVar113;
  float fVar116;
  float fVar117;
  float fVar118;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  float fVar119;
  float fVar122;
  float fVar123;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined4 uVar124;
  undefined1 auVar125 [32];
  float fVar127;
  float fVar128;
  undefined1 auVar126 [32];
  float fVar129;
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar130 [32];
  float fVar134;
  float fVar136;
  float fVar137;
  float fVar138;
  undefined1 auVar135 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  RTCFilterFunctionNArguments local_15d0;
  undefined1 local_15a0 [32];
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1510 [16];
  undefined1 local_1500 [32];
  float local_14d0;
  float fStack_14cc;
  float fStack_14c8;
  float fStack_14c4;
  float local_14c0;
  float fStack_14bc;
  float fStack_14b8;
  float fStack_14b4;
  float local_14b0;
  float fStack_14ac;
  float fStack_14a8;
  float fStack_14a4;
  float local_14a0;
  float fStack_149c;
  float fStack_1498;
  float fStack_1494;
  float local_1490;
  float fStack_148c;
  float fStack_1488;
  float fStack_1484;
  float local_1480;
  float fStack_147c;
  float fStack_1478;
  float fStack_1474;
  undefined1 local_1470 [16];
  undefined1 local_1460 [16];
  undefined1 local_1450 [16];
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined1 local_1420 [16];
  undefined4 uStack_1410;
  undefined4 uStack_140c;
  undefined4 uStack_1408;
  undefined4 uStack_1404;
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  float local_12e0 [4];
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  undefined4 uStack_12c4;
  float local_12c0 [4];
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  undefined4 uStack_12a4;
  float local_12a0 [4];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  undefined4 uStack_1284;
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [8];
  float fStack_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  undefined4 uStack_1224;
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  float local_1180;
  float fStack_117c;
  float fStack_1178;
  float fStack_1174;
  float fStack_1170;
  float fStack_116c;
  float fStack_1168;
  float fStack_1164;
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  RTCHitN local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  undefined1 auVar75 [32];
  
  pauVar41 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar124 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1450._4_4_ = uVar124;
  local_1450._0_4_ = uVar124;
  local_1450._8_4_ = uVar124;
  local_1450._12_4_ = uVar124;
  auVar100 = ZEXT1664(local_1450);
  uVar124 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1460._4_4_ = uVar124;
  local_1460._0_4_ = uVar124;
  local_1460._8_4_ = uVar124;
  local_1460._12_4_ = uVar124;
  auVar103 = ZEXT1664(local_1460);
  uVar124 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_1470._4_4_ = uVar124;
  local_1470._0_4_ = uVar124;
  local_1470._8_4_ = uVar124;
  local_1470._12_4_ = uVar124;
  auVar112 = ZEXT1664(local_1470);
  fStack_14a4 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fStack_14b4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fStack_14c4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fStack_1474 = fStack_14a4 * 0.99999964;
  fStack_1484 = fStack_14b4 * 0.99999964;
  fStack_1494 = fStack_14c4 * 0.99999964;
  fStack_14a4 = fStack_14a4 * 1.0000004;
  fStack_14b4 = fStack_14b4 * 1.0000004;
  fStack_14c4 = fStack_14c4 * 1.0000004;
  uVar49 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar51 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar50 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar39 = (tray->tnear).field_0.i[k];
  local_1510._4_4_ = iVar39;
  local_1510._0_4_ = iVar39;
  local_1510._8_4_ = iVar39;
  local_1510._12_4_ = iVar39;
  auVar99 = ZEXT1664(local_1510);
  iVar39 = (tray->tfar).field_0.i[k];
  auVar55 = ZEXT1664(CONCAT412(iVar39,CONCAT48(iVar39,CONCAT44(iVar39,iVar39))));
  local_1220._16_16_ = mm_lookupmask_ps._240_16_;
  local_1220._0_16_ = mm_lookupmask_ps._0_16_;
  iVar39 = 1 << ((uint)k & 0x1f);
  auVar58._4_4_ = iVar39;
  auVar58._0_4_ = iVar39;
  auVar58._8_4_ = iVar39;
  auVar58._12_4_ = iVar39;
  auVar58._16_4_ = iVar39;
  auVar58._20_4_ = iVar39;
  auVar58._24_4_ = iVar39;
  auVar58._28_4_ = iVar39;
  auVar59 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar58 = vpand_avx2(auVar58,auVar59);
  local_1260 = vpcmpeqd_avx2(auVar58,auVar59);
  auVar64._8_4_ = 0x3f800000;
  auVar64._0_8_ = 0x3f8000003f800000;
  auVar64._12_4_ = 0x3f800000;
  auVar64._16_4_ = 0x3f800000;
  auVar64._20_4_ = 0x3f800000;
  auVar64._24_4_ = 0x3f800000;
  auVar64._28_4_ = 0x3f800000;
  auVar59._8_4_ = 0xbf800000;
  auVar59._0_8_ = 0xbf800000bf800000;
  auVar59._12_4_ = 0xbf800000;
  auVar59._16_4_ = 0xbf800000;
  auVar59._20_4_ = 0xbf800000;
  auVar59._24_4_ = 0xbf800000;
  auVar59._28_4_ = 0xbf800000;
  _local_1240 = vblendvps_avx(auVar64,auVar59,local_1220);
  fStack_1478 = fStack_1474;
  fStack_147c = fStack_1474;
  local_1480 = fStack_1474;
  fStack_1488 = fStack_1484;
  fStack_148c = fStack_1484;
  local_1490 = fStack_1484;
  fStack_1498 = fStack_1494;
  fStack_149c = fStack_1494;
  local_14a0 = fStack_1494;
  fStack_14a8 = fStack_14a4;
  fStack_14ac = fStack_14a4;
  local_14b0 = fStack_14a4;
  fStack_14b8 = fStack_14b4;
  fStack_14bc = fStack_14b4;
  local_14c0 = fStack_14b4;
  fStack_14c8 = fStack_14c4;
  fStack_14cc = fStack_14c4;
  local_14d0 = fStack_14c4;
  fVar138 = fStack_14c4;
  fVar137 = fStack_14c4;
  fVar136 = fStack_14c4;
  fVar134 = fStack_14c4;
  fVar133 = fStack_14b4;
  fVar132 = fStack_14b4;
  fVar131 = fStack_14b4;
  fVar129 = fStack_14b4;
  fVar128 = fStack_14a4;
  fVar127 = fStack_14a4;
  fVar97 = fStack_14a4;
  fVar96 = fStack_14a4;
  fVar95 = fStack_1494;
  fVar94 = fStack_1494;
  fVar93 = fStack_1494;
  fVar101 = fStack_1494;
  fVar88 = fStack_1484;
  fVar123 = fStack_1484;
  fVar122 = fStack_1484;
  fVar119 = fStack_1484;
  fVar118 = fStack_1474;
  fVar117 = fStack_1474;
  fVar116 = fStack_1474;
  fVar113 = fStack_1474;
LAB_005804be:
  do {
    pauVar38 = pauVar41 + -1;
    pauVar41 = pauVar41 + -1;
    if (*(float *)(*pauVar38 + 8) <= *(float *)(ray + k * 4 + 0x100)) {
      uVar47 = *(ulong *)*pauVar41;
      while ((uVar47 & 8) == 0) {
        auVar57 = vsubps_avx(*(undefined1 (*) [16])(uVar47 + 0x20 + uVar49),auVar100._0_16_);
        auVar56._0_4_ = fVar113 * auVar57._0_4_;
        auVar56._4_4_ = fVar116 * auVar57._4_4_;
        auVar56._8_4_ = fVar117 * auVar57._8_4_;
        auVar56._12_4_ = fVar118 * auVar57._12_4_;
        auVar57 = vsubps_avx(*(undefined1 (*) [16])(uVar47 + 0x20 + uVar51),auVar103._0_16_);
        auVar67._0_4_ = fVar119 * auVar57._0_4_;
        auVar67._4_4_ = fVar122 * auVar57._4_4_;
        auVar67._8_4_ = fVar123 * auVar57._8_4_;
        auVar67._12_4_ = fVar88 * auVar57._12_4_;
        auVar57 = vmaxps_avx(auVar56,auVar67);
        auVar56 = vsubps_avx(*(undefined1 (*) [16])(uVar47 + 0x20 + uVar50),auVar112._0_16_);
        auVar68._0_4_ = fVar101 * auVar56._0_4_;
        auVar68._4_4_ = fVar93 * auVar56._4_4_;
        auVar68._8_4_ = fVar94 * auVar56._8_4_;
        auVar68._12_4_ = fVar95 * auVar56._12_4_;
        auVar56 = vmaxps_avx(auVar68,auVar99._0_16_);
        local_1420 = vmaxps_avx(auVar57,auVar56);
        auVar57 = vsubps_avx(*(undefined1 (*) [16])(uVar47 + 0x20 + (uVar49 ^ 0x10)),auVar100._0_16_
                            );
        auVar69._0_4_ = fVar96 * auVar57._0_4_;
        auVar69._4_4_ = fVar97 * auVar57._4_4_;
        auVar69._8_4_ = fVar127 * auVar57._8_4_;
        auVar69._12_4_ = fVar128 * auVar57._12_4_;
        auVar57 = vsubps_avx(*(undefined1 (*) [16])(uVar47 + 0x20 + (uVar51 ^ 0x10)),auVar103._0_16_
                            );
        auVar76._0_4_ = fVar129 * auVar57._0_4_;
        auVar76._4_4_ = fVar131 * auVar57._4_4_;
        auVar76._8_4_ = fVar132 * auVar57._8_4_;
        auVar76._12_4_ = fVar133 * auVar57._12_4_;
        auVar57 = vminps_avx(auVar69,auVar76);
        auVar56 = vsubps_avx(*(undefined1 (*) [16])(uVar47 + 0x20 + (uVar50 ^ 0x10)),auVar112._0_16_
                            );
        auVar77._0_4_ = fVar134 * auVar56._0_4_;
        auVar77._4_4_ = fVar136 * auVar56._4_4_;
        auVar77._8_4_ = fVar137 * auVar56._8_4_;
        auVar77._12_4_ = fVar138 * auVar56._12_4_;
        auVar56 = vminps_avx(auVar77,auVar55._0_16_);
        auVar57 = vminps_avx(auVar57,auVar56);
        auVar57 = vcmpps_avx(local_1420,auVar57,2);
        uVar45 = vmovmskps_avx(auVar57);
        if (uVar45 == 0) {
          if (pauVar41 == (undefined1 (*) [16])&local_fa0) {
            return;
          }
          goto LAB_005804be;
        }
        uVar45 = uVar45 & 0xff;
        uVar44 = uVar47 & 0xfffffffffffffff0;
        lVar43 = 0;
        for (uVar47 = (ulong)uVar45; (uVar47 & 1) == 0; uVar47 = uVar47 >> 1 | 0x8000000000000000) {
          lVar43 = lVar43 + 1;
        }
        uVar47 = *(ulong *)(uVar44 + lVar43 * 8);
        uVar45 = uVar45 - 1 & uVar45;
        uVar46 = (ulong)uVar45;
        if (uVar45 != 0) {
          uVar40 = *(uint *)(local_1420 + lVar43 * 4);
          lVar43 = 0;
          for (; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000) {
            lVar43 = lVar43 + 1;
          }
          uVar45 = uVar45 - 1 & uVar45;
          uVar48 = (ulong)uVar45;
          uVar46 = *(ulong *)(uVar44 + lVar43 * 8);
          uVar3 = *(uint *)(local_1420 + lVar43 * 4);
          if (uVar45 == 0) {
            if (uVar40 < uVar3) {
              *(ulong *)*pauVar41 = uVar46;
              *(uint *)(*pauVar41 + 8) = uVar3;
              pauVar41 = pauVar41 + 1;
            }
            else {
              *(ulong *)*pauVar41 = uVar47;
              *(uint *)(*pauVar41 + 8) = uVar40;
              pauVar41 = pauVar41 + 1;
              uVar47 = uVar46;
            }
          }
          else {
            auVar57._8_8_ = 0;
            auVar57._0_8_ = uVar47;
            auVar57 = vpunpcklqdq_avx(auVar57,ZEXT416(uVar40));
            auVar70._8_8_ = 0;
            auVar70._0_8_ = uVar46;
            auVar56 = vpunpcklqdq_avx(auVar70,ZEXT416(uVar3));
            lVar43 = 0;
            for (; (uVar48 & 1) == 0; uVar48 = uVar48 >> 1 | 0x8000000000000000) {
              lVar43 = lVar43 + 1;
            }
            uVar45 = uVar45 - 1 & uVar45;
            uVar47 = (ulong)uVar45;
            auVar78._8_8_ = 0;
            auVar78._0_8_ = *(ulong *)(uVar44 + lVar43 * 8);
            auVar68 = vpunpcklqdq_avx(auVar78,ZEXT416(*(uint *)(local_1420 + lVar43 * 4)));
            auVar67 = vpcmpgtd_avx(auVar56,auVar57);
            if (uVar45 == 0) {
              auVar69 = vpshufd_avx(auVar67,0xaa);
              auVar67 = vblendvps_avx(auVar56,auVar57,auVar69);
              auVar57 = vblendvps_avx(auVar57,auVar56,auVar69);
              auVar56 = vpcmpgtd_avx(auVar68,auVar67);
              auVar69 = vpshufd_avx(auVar56,0xaa);
              auVar56 = vblendvps_avx(auVar68,auVar67,auVar69);
              auVar67 = vblendvps_avx(auVar67,auVar68,auVar69);
              auVar68 = vpcmpgtd_avx(auVar67,auVar57);
              auVar69 = vpshufd_avx(auVar68,0xaa);
              auVar68 = vblendvps_avx(auVar67,auVar57,auVar69);
              auVar57 = vblendvps_avx(auVar57,auVar67,auVar69);
              *pauVar41 = auVar57;
              pauVar41[1] = auVar68;
              uVar47 = auVar56._0_8_;
              pauVar41 = pauVar41 + 2;
            }
            else {
              lVar43 = 0;
              for (; (uVar47 & 1) == 0; uVar47 = uVar47 >> 1 | 0x8000000000000000) {
                lVar43 = lVar43 + 1;
              }
              auVar89._8_8_ = 0;
              auVar89._0_8_ = *(ulong *)(uVar44 + lVar43 * 8);
              auVar76 = vpunpcklqdq_avx(auVar89,ZEXT416(*(uint *)(local_1420 + lVar43 * 4)));
              auVar69 = vpshufd_avx(auVar67,0xaa);
              auVar67 = vblendvps_avx(auVar56,auVar57,auVar69);
              auVar57 = vblendvps_avx(auVar57,auVar56,auVar69);
              auVar56 = vpcmpgtd_avx(auVar76,auVar68);
              auVar69 = vpshufd_avx(auVar56,0xaa);
              auVar56 = vblendvps_avx(auVar76,auVar68,auVar69);
              auVar68 = vblendvps_avx(auVar68,auVar76,auVar69);
              auVar69 = vpcmpgtd_avx(auVar68,auVar57);
              auVar76 = vpshufd_avx(auVar69,0xaa);
              auVar69 = vblendvps_avx(auVar68,auVar57,auVar76);
              auVar57 = vblendvps_avx(auVar57,auVar68,auVar76);
              auVar68 = vpcmpgtd_avx(auVar56,auVar67);
              auVar76 = vpshufd_avx(auVar68,0xaa);
              auVar68 = vblendvps_avx(auVar56,auVar67,auVar76);
              auVar56 = vblendvps_avx(auVar67,auVar56,auVar76);
              auVar67 = vpcmpgtd_avx(auVar69,auVar56);
              auVar76 = vpshufd_avx(auVar67,0xaa);
              auVar67 = vblendvps_avx(auVar69,auVar56,auVar76);
              auVar56 = vblendvps_avx(auVar56,auVar69,auVar76);
              *pauVar41 = auVar57;
              pauVar41[1] = auVar56;
              pauVar41[2] = auVar67;
              auVar99 = ZEXT1664(local_1510);
              uVar47 = auVar68._0_8_;
              pauVar41 = pauVar41 + 3;
            }
          }
        }
      }
      uVar44 = (ulong)((uint)uVar47 & 0xf);
      if (uVar44 != 8) {
        uVar47 = uVar47 & 0xfffffffffffffff0;
        lVar43 = 0;
        do {
          lVar42 = lVar43 * 0x60;
          pSVar4 = context->scene;
          ppfVar5 = (pSVar4->vertices).items;
          pfVar6 = ppfVar5[*(uint *)(uVar47 + 0x40 + lVar42)];
          auVar72._16_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar47 + 0x20 + lVar42));
          auVar72._0_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar47 + lVar42));
          pfVar7 = ppfVar5[*(uint *)(uVar47 + 0x48 + lVar42)];
          auVar79._16_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar47 + 0x28 + lVar42));
          auVar79._0_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar47 + 8 + lVar42));
          pfVar8 = ppfVar5[*(uint *)(uVar47 + 0x44 + lVar42)];
          auVar90._16_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar47 + 0x24 + lVar42));
          auVar90._0_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar47 + 4 + lVar42));
          pfVar9 = ppfVar5[*(uint *)(uVar47 + 0x4c + lVar42)];
          auVar110._16_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar47 + 0x2c + lVar42));
          auVar110._0_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar47 + 0xc + lVar42));
          lVar1 = uVar47 + 0x40 + lVar42;
          local_10e0 = *(undefined8 *)(lVar1 + 0x10);
          uStack_10d8 = *(undefined8 *)(lVar1 + 0x18);
          uStack_10d0 = local_10e0;
          uStack_10c8 = uStack_10d8;
          lVar1 = uVar47 + 0x50 + lVar42;
          local_1440 = *(undefined8 *)(lVar1 + 0x10);
          uStack_1438 = *(undefined8 *)(lVar1 + 0x18);
          auVar67 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar47 + 0x10 + lVar42))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar47 + 0x18 + lVar42)));
          auVar57 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar47 + 0x10 + lVar42))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar47 + 0x18 + lVar42)));
          auVar68 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar47 + 0x14 + lVar42))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar47 + 0x1c + lVar42)));
          auVar56 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar47 + 0x14 + lVar42))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar47 + 0x1c + lVar42)));
          auVar69 = vunpcklps_avx(auVar57,auVar56);
          auVar76 = vunpcklps_avx(auVar67,auVar68);
          auVar57 = vunpckhps_avx(auVar67,auVar68);
          auVar68 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar47 + 0x30 + lVar42))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar47 + 0x38 + lVar42)));
          auVar56 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar47 + 0x30 + lVar42))
                                  ,*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar47 + 0x38 + lVar42)));
          auVar77 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar47 + 0x34 + lVar42))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar47 + 0x3c + lVar42)));
          auVar67 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar47 + 0x34 + lVar42))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar47 + 0x3c + lVar42)));
          auVar67 = vunpcklps_avx(auVar56,auVar67);
          auVar70 = vunpcklps_avx(auVar68,auVar77);
          auVar56 = vunpckhps_avx(auVar68,auVar77);
          uStack_1430 = local_1440;
          uStack_1428 = uStack_1438;
          auVar58 = vunpcklps_avx(auVar90,auVar110);
          auVar59 = vunpcklps_avx(auVar72,auVar79);
          auVar86 = vunpcklps_avx(auVar59,auVar58);
          auVar58 = vunpckhps_avx(auVar59,auVar58);
          auVar59 = vunpckhps_avx(auVar90,auVar110);
          auVar64 = vunpckhps_avx(auVar72,auVar79);
          auVar59 = vunpcklps_avx(auVar64,auVar59);
          auVar80._16_16_ = auVar76;
          auVar80._0_16_ = auVar76;
          auVar91._16_16_ = auVar57;
          auVar91._0_16_ = auVar57;
          auVar60._16_16_ = auVar69;
          auVar60._0_16_ = auVar69;
          auVar135._16_16_ = auVar70;
          auVar135._0_16_ = auVar70;
          auVar83._16_16_ = auVar56;
          auVar83._0_16_ = auVar56;
          uVar124 = *(undefined4 *)(ray + k * 4);
          auVar102._4_4_ = uVar124;
          auVar102._0_4_ = uVar124;
          auVar102._8_4_ = uVar124;
          auVar102._12_4_ = uVar124;
          auVar102._16_4_ = uVar124;
          auVar102._20_4_ = uVar124;
          auVar102._24_4_ = uVar124;
          auVar102._28_4_ = uVar124;
          uVar124 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar120._4_4_ = uVar124;
          auVar120._0_4_ = uVar124;
          auVar120._8_4_ = uVar124;
          auVar120._12_4_ = uVar124;
          auVar120._16_4_ = uVar124;
          auVar120._20_4_ = uVar124;
          auVar120._24_4_ = uVar124;
          auVar120._28_4_ = uVar124;
          auVar52._16_16_ = auVar67;
          auVar52._0_16_ = auVar67;
          uVar124 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar126._4_4_ = uVar124;
          auVar126._0_4_ = uVar124;
          auVar126._8_4_ = uVar124;
          auVar126._12_4_ = uVar124;
          auVar126._16_4_ = uVar124;
          auVar126._20_4_ = uVar124;
          auVar126._24_4_ = uVar124;
          auVar126._28_4_ = uVar124;
          auVar86 = vsubps_avx(auVar86,auVar102);
          auVar72 = vsubps_avx(auVar58,auVar120);
          local_15a0 = vsubps_avx(auVar59,auVar126);
          auVar58 = vsubps_avx(auVar80,auVar102);
          auVar59 = vsubps_avx(auVar91,auVar120);
          auVar64 = vsubps_avx(auVar60,auVar126);
          auVar60 = vsubps_avx(auVar135,auVar102);
          auVar79 = vsubps_avx(auVar83,auVar120);
          auVar17 = vsubps_avx(auVar52,auVar126);
          local_1100 = vsubps_avx(auVar60,auVar86);
          local_1140 = vsubps_avx(auVar79,auVar72);
          local_1120 = vsubps_avx(auVar17,local_15a0);
          auVar53._0_4_ = auVar86._0_4_ + auVar60._0_4_;
          auVar53._4_4_ = auVar86._4_4_ + auVar60._4_4_;
          auVar53._8_4_ = auVar86._8_4_ + auVar60._8_4_;
          auVar53._12_4_ = auVar86._12_4_ + auVar60._12_4_;
          auVar53._16_4_ = auVar86._16_4_ + auVar60._16_4_;
          auVar53._20_4_ = auVar86._20_4_ + auVar60._20_4_;
          auVar53._24_4_ = auVar86._24_4_ + auVar60._24_4_;
          auVar53._28_4_ = auVar86._28_4_ + auVar60._28_4_;
          auVar73._0_4_ = auVar72._0_4_ + auVar79._0_4_;
          auVar73._4_4_ = auVar72._4_4_ + auVar79._4_4_;
          auVar73._8_4_ = auVar72._8_4_ + auVar79._8_4_;
          auVar73._12_4_ = auVar72._12_4_ + auVar79._12_4_;
          auVar73._16_4_ = auVar72._16_4_ + auVar79._16_4_;
          auVar73._20_4_ = auVar72._20_4_ + auVar79._20_4_;
          auVar73._24_4_ = auVar72._24_4_ + auVar79._24_4_;
          auVar73._28_4_ = auVar72._28_4_ + auVar79._28_4_;
          fVar113 = local_15a0._0_4_;
          auVar84._0_4_ = auVar17._0_4_ + fVar113;
          fVar116 = local_15a0._4_4_;
          auVar84._4_4_ = auVar17._4_4_ + fVar116;
          fVar117 = local_15a0._8_4_;
          auVar84._8_4_ = auVar17._8_4_ + fVar117;
          fVar118 = local_15a0._12_4_;
          auVar84._12_4_ = auVar17._12_4_ + fVar118;
          fVar119 = local_15a0._16_4_;
          auVar84._16_4_ = auVar17._16_4_ + fVar119;
          fVar122 = local_15a0._20_4_;
          auVar84._20_4_ = auVar17._20_4_ + fVar122;
          fVar123 = local_15a0._24_4_;
          auVar84._24_4_ = auVar17._24_4_ + fVar123;
          fVar88 = local_15a0._28_4_;
          auVar84._28_4_ = auVar17._28_4_ + fVar88;
          auVar18._4_4_ = local_1120._4_4_ * auVar73._4_4_;
          auVar18._0_4_ = local_1120._0_4_ * auVar73._0_4_;
          auVar18._8_4_ = local_1120._8_4_ * auVar73._8_4_;
          auVar18._12_4_ = local_1120._12_4_ * auVar73._12_4_;
          auVar18._16_4_ = local_1120._16_4_ * auVar73._16_4_;
          auVar18._20_4_ = local_1120._20_4_ * auVar73._20_4_;
          auVar18._24_4_ = local_1120._24_4_ * auVar73._24_4_;
          auVar18._28_4_ = uVar124;
          auVar56 = vfmsub231ps_fma(auVar18,local_1140,auVar84);
          auVar19._4_4_ = local_1100._4_4_ * auVar84._4_4_;
          auVar19._0_4_ = local_1100._0_4_ * auVar84._0_4_;
          auVar19._8_4_ = local_1100._8_4_ * auVar84._8_4_;
          auVar19._12_4_ = local_1100._12_4_ * auVar84._12_4_;
          auVar19._16_4_ = local_1100._16_4_ * auVar84._16_4_;
          auVar19._20_4_ = local_1100._20_4_ * auVar84._20_4_;
          auVar19._24_4_ = local_1100._24_4_ * auVar84._24_4_;
          auVar19._28_4_ = auVar84._28_4_;
          auVar57 = vfmsub231ps_fma(auVar19,local_1120,auVar53);
          auVar20._4_4_ = local_1140._4_4_ * auVar53._4_4_;
          auVar20._0_4_ = local_1140._0_4_ * auVar53._0_4_;
          auVar20._8_4_ = local_1140._8_4_ * auVar53._8_4_;
          auVar20._12_4_ = local_1140._12_4_ * auVar53._12_4_;
          auVar20._16_4_ = local_1140._16_4_ * auVar53._16_4_;
          auVar20._20_4_ = local_1140._20_4_ * auVar53._20_4_;
          auVar20._24_4_ = local_1140._24_4_ * auVar53._24_4_;
          auVar20._28_4_ = auVar53._28_4_;
          auVar67 = vfmsub231ps_fma(auVar20,local_1100,auVar73);
          uVar124 = *(undefined4 *)(ray + k * 4 + 0xa0);
          auVar121._4_4_ = uVar124;
          auVar121._0_4_ = uVar124;
          auVar121._8_4_ = uVar124;
          auVar121._12_4_ = uVar124;
          auVar121._16_4_ = uVar124;
          auVar121._20_4_ = uVar124;
          auVar121._24_4_ = uVar124;
          auVar121._28_4_ = uVar124;
          local_1180 = *(float *)(ray + k * 4 + 0xc0);
          auVar21._4_4_ = local_1180 * auVar67._4_4_;
          auVar21._0_4_ = local_1180 * auVar67._0_4_;
          auVar21._8_4_ = local_1180 * auVar67._8_4_;
          auVar21._12_4_ = local_1180 * auVar67._12_4_;
          auVar21._16_4_ = local_1180 * 0.0;
          auVar21._20_4_ = local_1180 * 0.0;
          auVar21._24_4_ = local_1180 * 0.0;
          auVar21._28_4_ = auVar73._28_4_;
          auVar57 = vfmadd231ps_fma(auVar21,auVar121,ZEXT1632(auVar57));
          uVar124 = *(undefined4 *)(ray + k * 4 + 0x80);
          local_1160._4_4_ = uVar124;
          local_1160._0_4_ = uVar124;
          local_1160._8_4_ = uVar124;
          local_1160._12_4_ = uVar124;
          local_1160._16_4_ = uVar124;
          local_1160._20_4_ = uVar124;
          local_1160._24_4_ = uVar124;
          local_1160._28_4_ = uVar124;
          local_1420 = vfmadd231ps_fma(ZEXT1632(auVar57),local_1160,ZEXT1632(auVar56));
          local_11a0 = vsubps_avx(auVar72,auVar59);
          local_11c0 = vsubps_avx(local_15a0,auVar64);
          auVar130._0_4_ = auVar72._0_4_ + auVar59._0_4_;
          auVar130._4_4_ = auVar72._4_4_ + auVar59._4_4_;
          auVar130._8_4_ = auVar72._8_4_ + auVar59._8_4_;
          auVar130._12_4_ = auVar72._12_4_ + auVar59._12_4_;
          auVar130._16_4_ = auVar72._16_4_ + auVar59._16_4_;
          auVar130._20_4_ = auVar72._20_4_ + auVar59._20_4_;
          auVar130._24_4_ = auVar72._24_4_ + auVar59._24_4_;
          auVar130._28_4_ = auVar72._28_4_ + auVar59._28_4_;
          auVar85._0_4_ = fVar113 + auVar64._0_4_;
          auVar85._4_4_ = fVar116 + auVar64._4_4_;
          auVar85._8_4_ = fVar117 + auVar64._8_4_;
          auVar85._12_4_ = fVar118 + auVar64._12_4_;
          auVar85._16_4_ = fVar119 + auVar64._16_4_;
          auVar85._20_4_ = fVar122 + auVar64._20_4_;
          auVar85._24_4_ = fVar123 + auVar64._24_4_;
          fVar101 = auVar64._28_4_;
          auVar85._28_4_ = fVar88 + fVar101;
          fVar93 = local_11c0._0_4_;
          fVar95 = local_11c0._4_4_;
          auVar22._4_4_ = auVar130._4_4_ * fVar95;
          auVar22._0_4_ = auVar130._0_4_ * fVar93;
          fVar127 = local_11c0._8_4_;
          auVar22._8_4_ = auVar130._8_4_ * fVar127;
          fVar131 = local_11c0._12_4_;
          auVar22._12_4_ = auVar130._12_4_ * fVar131;
          fVar134 = local_11c0._16_4_;
          auVar22._16_4_ = auVar130._16_4_ * fVar134;
          fVar138 = local_11c0._20_4_;
          auVar22._20_4_ = auVar130._20_4_ * fVar138;
          fVar14 = local_11c0._24_4_;
          auVar22._24_4_ = auVar130._24_4_ * fVar14;
          auVar22._28_4_ = fVar88;
          auVar56 = vfmsub231ps_fma(auVar22,local_11a0,auVar85);
          auVar18 = vsubps_avx(auVar86,auVar58);
          fVar88 = auVar18._0_4_;
          fVar96 = auVar18._4_4_;
          auVar23._4_4_ = auVar85._4_4_ * fVar96;
          auVar23._0_4_ = auVar85._0_4_ * fVar88;
          fVar128 = auVar18._8_4_;
          auVar23._8_4_ = auVar85._8_4_ * fVar128;
          fVar132 = auVar18._12_4_;
          auVar23._12_4_ = auVar85._12_4_ * fVar132;
          fVar136 = auVar18._16_4_;
          auVar23._16_4_ = auVar85._16_4_ * fVar136;
          fVar12 = auVar18._20_4_;
          auVar23._20_4_ = auVar85._20_4_ * fVar12;
          fVar15 = auVar18._24_4_;
          auVar23._24_4_ = auVar85._24_4_ * fVar15;
          auVar23._28_4_ = auVar85._28_4_;
          auVar114._0_4_ = auVar86._0_4_ + auVar58._0_4_;
          auVar114._4_4_ = auVar86._4_4_ + auVar58._4_4_;
          auVar114._8_4_ = auVar86._8_4_ + auVar58._8_4_;
          auVar114._12_4_ = auVar86._12_4_ + auVar58._12_4_;
          auVar114._16_4_ = auVar86._16_4_ + auVar58._16_4_;
          auVar114._20_4_ = auVar86._20_4_ + auVar58._20_4_;
          auVar114._24_4_ = auVar86._24_4_ + auVar58._24_4_;
          auVar114._28_4_ = auVar86._28_4_ + auVar58._28_4_;
          auVar57 = vfmsub231ps_fma(auVar23,local_11c0,auVar114);
          fVar94 = local_11a0._0_4_;
          fVar97 = local_11a0._4_4_;
          auVar24._4_4_ = auVar114._4_4_ * fVar97;
          auVar24._0_4_ = auVar114._0_4_ * fVar94;
          fVar129 = local_11a0._8_4_;
          auVar24._8_4_ = auVar114._8_4_ * fVar129;
          fVar133 = local_11a0._12_4_;
          auVar24._12_4_ = auVar114._12_4_ * fVar133;
          fVar137 = local_11a0._16_4_;
          auVar24._16_4_ = auVar114._16_4_ * fVar137;
          fVar13 = local_11a0._20_4_;
          auVar24._20_4_ = auVar114._20_4_ * fVar13;
          fVar16 = local_11a0._24_4_;
          auVar24._24_4_ = auVar114._24_4_ * fVar16;
          auVar24._28_4_ = local_11c0._28_4_;
          auVar67 = vfmsub231ps_fma(auVar24,auVar18,auVar130);
          auVar25._4_4_ = auVar67._4_4_ * local_1180;
          auVar25._0_4_ = auVar67._0_4_ * local_1180;
          auVar25._8_4_ = auVar67._8_4_ * local_1180;
          auVar25._12_4_ = auVar67._12_4_ * local_1180;
          auVar25._16_4_ = local_1180 * 0.0;
          auVar25._20_4_ = local_1180 * 0.0;
          auVar25._24_4_ = local_1180 * 0.0;
          auVar25._28_4_ = auVar130._28_4_;
          auVar57 = vfmadd231ps_fma(auVar25,auVar121,ZEXT1632(auVar57));
          auVar57 = vfmadd231ps_fma(ZEXT1632(auVar57),local_1160,ZEXT1632(auVar56));
          auVar19 = vsubps_avx(auVar58,auVar60);
          auVar81._0_4_ = auVar58._0_4_ + auVar60._0_4_;
          auVar81._4_4_ = auVar58._4_4_ + auVar60._4_4_;
          auVar81._8_4_ = auVar58._8_4_ + auVar60._8_4_;
          auVar81._12_4_ = auVar58._12_4_ + auVar60._12_4_;
          auVar81._16_4_ = auVar58._16_4_ + auVar60._16_4_;
          auVar81._20_4_ = auVar58._20_4_ + auVar60._20_4_;
          auVar81._24_4_ = auVar58._24_4_ + auVar60._24_4_;
          auVar81._28_4_ = auVar58._28_4_ + auVar60._28_4_;
          auVar60 = vsubps_avx(auVar59,auVar79);
          auVar92._0_4_ = auVar59._0_4_ + auVar79._0_4_;
          auVar92._4_4_ = auVar59._4_4_ + auVar79._4_4_;
          auVar92._8_4_ = auVar59._8_4_ + auVar79._8_4_;
          auVar92._12_4_ = auVar59._12_4_ + auVar79._12_4_;
          auVar92._16_4_ = auVar59._16_4_ + auVar79._16_4_;
          auVar92._20_4_ = auVar59._20_4_ + auVar79._20_4_;
          auVar92._24_4_ = auVar59._24_4_ + auVar79._24_4_;
          auVar92._28_4_ = auVar59._28_4_ + auVar79._28_4_;
          auVar79 = vsubps_avx(auVar64,auVar17);
          auVar61._0_4_ = auVar64._0_4_ + auVar17._0_4_;
          auVar61._4_4_ = auVar64._4_4_ + auVar17._4_4_;
          auVar61._8_4_ = auVar64._8_4_ + auVar17._8_4_;
          auVar61._12_4_ = auVar64._12_4_ + auVar17._12_4_;
          auVar61._16_4_ = auVar64._16_4_ + auVar17._16_4_;
          auVar61._20_4_ = auVar64._20_4_ + auVar17._20_4_;
          auVar61._24_4_ = auVar64._24_4_ + auVar17._24_4_;
          auVar61._28_4_ = fVar101 + auVar17._28_4_;
          auVar17._4_4_ = auVar79._4_4_ * auVar92._4_4_;
          auVar17._0_4_ = auVar79._0_4_ * auVar92._0_4_;
          auVar17._8_4_ = auVar79._8_4_ * auVar92._8_4_;
          auVar17._12_4_ = auVar79._12_4_ * auVar92._12_4_;
          auVar17._16_4_ = auVar79._16_4_ * auVar92._16_4_;
          auVar17._20_4_ = auVar79._20_4_ * auVar92._20_4_;
          auVar17._24_4_ = auVar79._24_4_ * auVar92._24_4_;
          auVar17._28_4_ = fVar101;
          auVar67 = vfmsub231ps_fma(auVar17,auVar60,auVar61);
          auVar26._4_4_ = auVar61._4_4_ * auVar19._4_4_;
          auVar26._0_4_ = auVar61._0_4_ * auVar19._0_4_;
          auVar26._8_4_ = auVar61._8_4_ * auVar19._8_4_;
          auVar26._12_4_ = auVar61._12_4_ * auVar19._12_4_;
          auVar26._16_4_ = auVar61._16_4_ * auVar19._16_4_;
          auVar26._20_4_ = auVar61._20_4_ * auVar19._20_4_;
          auVar26._24_4_ = auVar61._24_4_ * auVar19._24_4_;
          auVar26._28_4_ = auVar61._28_4_;
          auVar56 = vfmsub231ps_fma(auVar26,auVar79,auVar81);
          auVar27._4_4_ = auVar60._4_4_ * auVar81._4_4_;
          auVar27._0_4_ = auVar60._0_4_ * auVar81._0_4_;
          auVar27._8_4_ = auVar60._8_4_ * auVar81._8_4_;
          auVar27._12_4_ = auVar60._12_4_ * auVar81._12_4_;
          auVar27._16_4_ = auVar60._16_4_ * auVar81._16_4_;
          auVar27._20_4_ = auVar60._20_4_ * auVar81._20_4_;
          auVar27._24_4_ = auVar60._24_4_ * auVar81._24_4_;
          auVar27._28_4_ = auVar81._28_4_;
          auVar68 = vfmsub231ps_fma(auVar27,auVar19,auVar92);
          fStack_117c = local_1180;
          fStack_1178 = local_1180;
          fStack_1174 = local_1180;
          fStack_1170 = local_1180;
          fStack_116c = local_1180;
          fStack_1168 = local_1180;
          fStack_1164 = local_1180;
          auVar82._0_4_ = local_1180 * auVar68._0_4_;
          auVar82._4_4_ = local_1180 * auVar68._4_4_;
          auVar82._8_4_ = local_1180 * auVar68._8_4_;
          auVar82._12_4_ = local_1180 * auVar68._12_4_;
          auVar82._16_4_ = local_1180 * 0.0;
          auVar82._20_4_ = local_1180 * 0.0;
          auVar82._24_4_ = local_1180 * 0.0;
          auVar82._28_4_ = 0;
          auVar56 = vfmadd231ps_fma(auVar82,auVar121,ZEXT1632(auVar56));
          auVar56 = vfmadd231ps_fma(ZEXT1632(auVar56),local_1160,ZEXT1632(auVar67));
          local_13e0 = ZEXT1632(CONCAT412(auVar56._12_4_ + auVar57._12_4_ + local_1420._12_4_,
                                          CONCAT48(auVar56._8_4_ + auVar57._8_4_ + local_1420._8_4_,
                                                   CONCAT44(auVar56._4_4_ +
                                                            auVar57._4_4_ + local_1420._4_4_,
                                                            auVar56._0_4_ +
                                                            auVar57._0_4_ + local_1420._0_4_))));
          auVar62._8_4_ = 0x7fffffff;
          auVar62._0_8_ = 0x7fffffff7fffffff;
          auVar62._12_4_ = 0x7fffffff;
          auVar62._16_4_ = 0x7fffffff;
          auVar62._20_4_ = 0x7fffffff;
          auVar62._24_4_ = 0x7fffffff;
          auVar62._28_4_ = 0x7fffffff;
          local_1400 = ZEXT1632(auVar57);
          auVar58 = vminps_avx(ZEXT1632(local_1420),local_1400);
          auVar58 = vminps_avx(auVar58,ZEXT1632(auVar56));
          local_1200 = vandps_avx(local_13e0,auVar62);
          fVar101 = local_1200._0_4_ * 1.1920929e-07;
          fVar104 = local_1200._4_4_ * 1.1920929e-07;
          auVar28._4_4_ = fVar104;
          auVar28._0_4_ = fVar101;
          fVar105 = local_1200._8_4_ * 1.1920929e-07;
          auVar28._8_4_ = fVar105;
          fVar106 = local_1200._12_4_ * 1.1920929e-07;
          auVar28._12_4_ = fVar106;
          fVar107 = local_1200._16_4_ * 1.1920929e-07;
          auVar28._16_4_ = fVar107;
          fVar108 = local_1200._20_4_ * 1.1920929e-07;
          auVar28._20_4_ = fVar108;
          fVar109 = local_1200._24_4_ * 1.1920929e-07;
          auVar28._24_4_ = fVar109;
          auVar28._28_4_ = 0x34000000;
          auVar98._0_8_ = CONCAT44(fVar104,fVar101) ^ 0x8000000080000000;
          auVar98._8_4_ = -fVar105;
          auVar98._12_4_ = -fVar106;
          auVar98._16_4_ = -fVar107;
          auVar98._20_4_ = -fVar108;
          auVar98._24_4_ = -fVar109;
          auVar98._28_4_ = 0xb4000000;
          auVar58 = vcmpps_avx(auVar58,auVar98,5);
          local_11e0 = ZEXT1632(local_1420);
          auVar64 = vmaxps_avx(ZEXT1632(local_1420),local_1400);
          auVar59 = vmaxps_avx(auVar64,ZEXT1632(auVar56));
          auVar59 = vcmpps_avx(auVar59,auVar28,2);
          auVar59 = vorps_avx(auVar58,auVar59);
          if ((((((((auVar59 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar59 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar59 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar59 >> 0x7f,0) != '\0') ||
                (auVar59 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar59 >> 0xbf,0) != '\0') ||
              (auVar59 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar59[0x1f] < '\0') {
            auVar29._4_4_ = fVar97 * local_1120._4_4_;
            auVar29._0_4_ = fVar94 * local_1120._0_4_;
            auVar29._8_4_ = fVar129 * local_1120._8_4_;
            auVar29._12_4_ = fVar133 * local_1120._12_4_;
            auVar29._16_4_ = fVar137 * local_1120._16_4_;
            auVar29._20_4_ = fVar13 * local_1120._20_4_;
            auVar29._24_4_ = fVar16 * local_1120._24_4_;
            auVar29._28_4_ = auVar58._28_4_;
            auVar30._4_4_ = local_1140._4_4_ * fVar96;
            auVar30._0_4_ = local_1140._0_4_ * fVar88;
            auVar30._8_4_ = local_1140._8_4_ * fVar128;
            auVar30._12_4_ = local_1140._12_4_ * fVar132;
            auVar30._16_4_ = local_1140._16_4_ * fVar136;
            auVar30._20_4_ = local_1140._20_4_ * fVar12;
            auVar30._24_4_ = local_1140._24_4_ * fVar15;
            auVar30._28_4_ = 0x34000000;
            auVar56 = vfmsub213ps_fma(local_1140,local_11c0,auVar29);
            auVar31._4_4_ = auVar60._4_4_ * fVar95;
            auVar31._0_4_ = auVar60._0_4_ * fVar93;
            auVar31._8_4_ = auVar60._8_4_ * fVar127;
            auVar31._12_4_ = auVar60._12_4_ * fVar131;
            auVar31._16_4_ = auVar60._16_4_ * fVar134;
            auVar31._20_4_ = auVar60._20_4_ * fVar138;
            auVar31._24_4_ = auVar60._24_4_ * fVar14;
            auVar31._28_4_ = auVar64._28_4_;
            auVar32._4_4_ = auVar79._4_4_ * fVar96;
            auVar32._0_4_ = auVar79._0_4_ * fVar88;
            auVar32._8_4_ = auVar79._8_4_ * fVar128;
            auVar32._12_4_ = auVar79._12_4_ * fVar132;
            auVar32._16_4_ = auVar79._16_4_ * fVar136;
            auVar32._20_4_ = auVar79._20_4_ * fVar12;
            auVar32._24_4_ = auVar79._24_4_ * fVar15;
            auVar32._28_4_ = local_1200._28_4_;
            auVar67 = vfmsub213ps_fma(auVar79,local_11a0,auVar31);
            auVar58 = vandps_avx(auVar29,auVar62);
            auVar64 = vandps_avx(auVar31,auVar62);
            auVar58 = vcmpps_avx(auVar58,auVar64,1);
            local_13c0 = vblendvps_avx(ZEXT1632(auVar67),ZEXT1632(auVar56),auVar58);
            auVar33._4_4_ = fVar97 * auVar19._4_4_;
            auVar33._0_4_ = fVar94 * auVar19._0_4_;
            auVar33._8_4_ = fVar129 * auVar19._8_4_;
            auVar33._12_4_ = fVar133 * auVar19._12_4_;
            auVar33._16_4_ = fVar137 * auVar19._16_4_;
            auVar33._20_4_ = fVar13 * auVar19._20_4_;
            auVar33._24_4_ = fVar16 * auVar19._24_4_;
            auVar33._28_4_ = auVar58._28_4_;
            auVar56 = vfmsub213ps_fma(auVar19,local_11c0,auVar32);
            auVar34._4_4_ = local_1100._4_4_ * fVar95;
            auVar34._0_4_ = local_1100._0_4_ * fVar93;
            auVar34._8_4_ = local_1100._8_4_ * fVar127;
            auVar34._12_4_ = local_1100._12_4_ * fVar131;
            auVar34._16_4_ = local_1100._16_4_ * fVar134;
            auVar34._20_4_ = local_1100._20_4_ * fVar138;
            auVar34._24_4_ = local_1100._24_4_ * fVar14;
            auVar34._28_4_ = auVar64._28_4_;
            auVar67 = vfmsub213ps_fma(local_1120,auVar18,auVar34);
            auVar58 = vandps_avx(auVar34,auVar62);
            auVar64 = vandps_avx(auVar32,auVar62);
            auVar58 = vcmpps_avx(auVar58,auVar64,1);
            local_13a0 = vblendvps_avx(ZEXT1632(auVar56),ZEXT1632(auVar67),auVar58);
            auVar56 = vfmsub213ps_fma(local_1100,local_11a0,auVar30);
            auVar67 = vfmsub213ps_fma(auVar60,auVar18,auVar33);
            auVar58 = vandps_avx(auVar30,auVar62);
            auVar64 = vandps_avx(auVar33,auVar62);
            auVar64 = vcmpps_avx(auVar58,auVar64,1);
            local_1380 = vblendvps_avx(ZEXT1632(auVar67),ZEXT1632(auVar56),auVar64);
            auVar56 = vpackssdw_avx(auVar59._0_16_,auVar59._16_16_);
            fVar88 = local_1380._0_4_;
            auVar63._0_4_ = fVar88 * local_1180;
            fVar101 = local_1380._4_4_;
            auVar63._4_4_ = fVar101 * local_1180;
            fVar93 = local_1380._8_4_;
            auVar63._8_4_ = fVar93 * local_1180;
            fVar94 = local_1380._12_4_;
            auVar63._12_4_ = fVar94 * local_1180;
            fVar95 = local_1380._16_4_;
            auVar63._16_4_ = fVar95 * local_1180;
            fVar96 = local_1380._20_4_;
            auVar63._20_4_ = fVar96 * local_1180;
            fVar97 = local_1380._24_4_;
            auVar63._24_4_ = fVar97 * local_1180;
            auVar63._28_4_ = 0;
            auVar67 = vfmadd213ps_fma(auVar121,local_13a0,auVar63);
            auVar67 = vfmadd213ps_fma(local_1160,local_13c0,ZEXT1632(auVar67));
            auVar64 = ZEXT1632(CONCAT412(auVar67._12_4_ + auVar67._12_4_,
                                         CONCAT48(auVar67._8_4_ + auVar67._8_4_,
                                                  CONCAT44(auVar67._4_4_ + auVar67._4_4_,
                                                           auVar67._0_4_ + auVar67._0_4_))));
            auVar35._4_4_ = fVar101 * fVar116;
            auVar35._0_4_ = fVar88 * fVar113;
            auVar35._8_4_ = fVar93 * fVar117;
            auVar35._12_4_ = fVar94 * fVar118;
            auVar35._16_4_ = fVar95 * fVar119;
            auVar35._20_4_ = fVar96 * fVar122;
            auVar35._24_4_ = fVar97 * fVar123;
            auVar35._28_4_ = auVar58._28_4_;
            auVar67 = vfmadd213ps_fma(auVar72,local_13a0,auVar35);
            auVar68 = vfmadd213ps_fma(auVar86,local_13c0,ZEXT1632(auVar67));
            auVar58 = vrcpps_avx(auVar64);
            auVar115._8_4_ = 0x3f800000;
            auVar115._0_8_ = 0x3f8000003f800000;
            auVar115._12_4_ = 0x3f800000;
            auVar115._16_4_ = 0x3f800000;
            auVar115._20_4_ = 0x3f800000;
            auVar115._24_4_ = 0x3f800000;
            auVar115._28_4_ = 0x3f800000;
            auVar67 = vfnmadd213ps_fma(auVar58,auVar64,auVar115);
            auVar67 = vfmadd132ps_fma(ZEXT1632(auVar67),auVar58,auVar58);
            local_1300._28_4_ = 0x3f800000;
            local_1300._0_28_ =
                 ZEXT1628(CONCAT412(auVar67._12_4_ * (auVar68._12_4_ + auVar68._12_4_),
                                    CONCAT48(auVar67._8_4_ * (auVar68._8_4_ + auVar68._8_4_),
                                             CONCAT44(auVar67._4_4_ *
                                                      (auVar68._4_4_ + auVar68._4_4_),
                                                      auVar67._0_4_ *
                                                      (auVar68._0_4_ + auVar68._0_4_)))));
            auVar99 = ZEXT3264(local_1300);
            uVar124 = *(undefined4 *)(ray + k * 4 + 0x60);
            auVar86._4_4_ = uVar124;
            auVar86._0_4_ = uVar124;
            auVar86._8_4_ = uVar124;
            auVar86._12_4_ = uVar124;
            auVar86._16_4_ = uVar124;
            auVar86._20_4_ = uVar124;
            auVar86._24_4_ = uVar124;
            auVar86._28_4_ = uVar124;
            uVar124 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar125._4_4_ = uVar124;
            auVar125._0_4_ = uVar124;
            auVar125._8_4_ = uVar124;
            auVar125._12_4_ = uVar124;
            auVar125._16_4_ = uVar124;
            auVar125._20_4_ = uVar124;
            auVar125._24_4_ = uVar124;
            auVar125._28_4_ = uVar124;
            auVar55 = ZEXT3264(auVar125);
            auVar58 = vcmpps_avx(auVar86,local_1300,2);
            auVar59 = vcmpps_avx(local_1300,auVar125,2);
            auVar58 = vandps_avx(auVar59,auVar58);
            auVar67 = vpackssdw_avx(auVar58._0_16_,auVar58._16_16_);
            auVar56 = vpand_avx(auVar67,auVar56);
            auVar58 = vpmovsxwd_avx2(auVar56);
            if ((((((((auVar58 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar58 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar58 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar58 >> 0x7f,0) != '\0') ||
                  (auVar58 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar58 >> 0xbf,0) != '\0') ||
                (auVar58 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar58[0x1f] < '\0') {
              auVar58 = vcmpps_avx(auVar64,_DAT_01faff00,4);
              auVar67 = vpackssdw_avx(auVar58._0_16_,auVar58._16_16_);
              auVar56 = vpand_avx(auVar56,auVar67);
              local_1540 = vpmovsxwd_avx2(auVar56);
              if ((((((((local_1540 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (local_1540 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_1540 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_1540 >> 0x7f,0) != '\0') ||
                    (local_1540 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(local_1540 >> 0xbf,0) != '\0') ||
                  (local_1540 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  local_1540[0x1f] < '\0') {
                uStack_1410 = 0;
                uStack_140c = 0;
                uStack_1408 = 0;
                uStack_1404 = 0;
                local_1360 = local_1540;
                local_1280 = local_1220;
                auVar58 = vrcpps_avx(local_13e0);
                auVar111._8_4_ = 0x3f800000;
                auVar111._0_8_ = 0x3f8000003f800000;
                auVar111._12_4_ = 0x3f800000;
                auVar111._16_4_ = 0x3f800000;
                auVar111._20_4_ = 0x3f800000;
                auVar111._24_4_ = 0x3f800000;
                auVar111._28_4_ = 0x3f800000;
                auVar67 = vfnmadd213ps_fma(local_13e0,auVar58,auVar111);
                auVar67 = vfmadd132ps_fma(ZEXT1632(auVar67),auVar58,auVar58);
                auVar87._8_4_ = 0x219392ef;
                auVar87._0_8_ = 0x219392ef219392ef;
                auVar87._12_4_ = 0x219392ef;
                auVar87._16_4_ = 0x219392ef;
                auVar87._20_4_ = 0x219392ef;
                auVar87._24_4_ = 0x219392ef;
                auVar87._28_4_ = 0x219392ef;
                auVar58 = vcmpps_avx(local_1200,auVar87,5);
                auVar58 = vandps_avx(auVar58,ZEXT1632(auVar67));
                auVar36._4_4_ = local_1420._4_4_ * auVar58._4_4_;
                auVar36._0_4_ = local_1420._0_4_ * auVar58._0_4_;
                auVar36._8_4_ = local_1420._8_4_ * auVar58._8_4_;
                auVar36._12_4_ = local_1420._12_4_ * auVar58._12_4_;
                auVar36._16_4_ = auVar58._16_4_ * 0.0;
                auVar36._20_4_ = auVar58._20_4_ * 0.0;
                auVar36._24_4_ = auVar58._24_4_ * 0.0;
                auVar36._28_4_ = 0;
                auVar59 = vminps_avx(auVar36,auVar111);
                auVar37._4_4_ = auVar57._4_4_ * auVar58._4_4_;
                auVar37._0_4_ = auVar57._0_4_ * auVar58._0_4_;
                auVar37._8_4_ = auVar57._8_4_ * auVar58._8_4_;
                auVar37._12_4_ = auVar57._12_4_ * auVar58._12_4_;
                auVar37._16_4_ = auVar58._16_4_ * 0.0;
                auVar37._20_4_ = auVar58._20_4_ * 0.0;
                auVar37._24_4_ = auVar58._24_4_ * 0.0;
                auVar37._28_4_ = auVar18._28_4_;
                auVar58 = vminps_avx(auVar37,auVar111);
                auVar64 = vsubps_avx(auVar111,auVar59);
                auVar86 = vsubps_avx(auVar111,auVar58);
                local_1320 = vblendvps_avx(auVar58,auVar64,local_1220);
                local_1340 = vblendvps_avx(auVar59,auVar86,local_1220);
                local_12e0[0] = local_13c0._0_4_ * (float)local_1240._0_4_;
                local_12e0[1] = local_13c0._4_4_ * (float)local_1240._4_4_;
                local_12e0[2] = local_13c0._8_4_ * fStack_1238;
                local_12e0[3] = local_13c0._12_4_ * fStack_1234;
                fStack_12d0 = local_13c0._16_4_ * fStack_1230;
                fStack_12cc = local_13c0._20_4_ * fStack_122c;
                fStack_12c8 = local_13c0._24_4_ * fStack_1228;
                uStack_12c4 = local_1340._28_4_;
                local_12c0[0] = (float)local_1240._0_4_ * local_13a0._0_4_;
                local_12c0[1] = (float)local_1240._4_4_ * local_13a0._4_4_;
                local_12c0[2] = fStack_1238 * local_13a0._8_4_;
                local_12c0[3] = fStack_1234 * local_13a0._12_4_;
                fStack_12b0 = fStack_1230 * local_13a0._16_4_;
                fStack_12ac = fStack_122c * local_13a0._20_4_;
                fStack_12a8 = fStack_1228 * local_13a0._24_4_;
                uStack_12a4 = local_1320._28_4_;
                local_12a0[0] = (float)local_1240._0_4_ * fVar88;
                local_12a0[1] = (float)local_1240._4_4_ * fVar101;
                local_12a0[2] = fStack_1238 * fVar93;
                local_12a0[3] = fStack_1234 * fVar94;
                fStack_1290 = fStack_1230 * fVar95;
                fStack_128c = fStack_122c * fVar96;
                fStack_1288 = fStack_1228 * fVar97;
                uStack_1284 = uStack_1224;
                auVar58 = vpmovsxwd_avx2(auVar56);
                auVar74._8_4_ = 0x7f800000;
                auVar74._0_8_ = 0x7f8000007f800000;
                auVar74._12_4_ = 0x7f800000;
                auVar74._16_4_ = 0x7f800000;
                auVar74._20_4_ = 0x7f800000;
                auVar74._24_4_ = 0x7f800000;
                auVar74._28_4_ = 0x7f800000;
                auVar58 = vblendvps_avx(auVar74,local_1300,auVar58);
                auVar59 = vshufps_avx(auVar58,auVar58,0xb1);
                auVar59 = vminps_avx(auVar58,auVar59);
                auVar64 = vshufpd_avx(auVar59,auVar59,5);
                auVar59 = vminps_avx(auVar59,auVar64);
                auVar64 = vpermpd_avx2(auVar59,0x4e);
                auVar59 = vminps_avx(auVar59,auVar64);
                auVar58 = vcmpps_avx(auVar58,auVar59,0);
                auVar57 = vpackssdw_avx(auVar58._0_16_,auVar58._16_16_);
                auVar57 = vpand_avx(auVar57,auVar56);
                auVar58 = vpmovsxwd_avx2(auVar57);
                if ((((((((auVar58 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar58 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar58 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar58 >> 0x7f,0) == '\0') &&
                      (auVar58 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar58 >> 0xbf,0) == '\0') &&
                    (auVar58 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar58[0x1f]) {
                  auVar58 = local_1540;
                }
                uVar40 = vmovmskps_avx(auVar58);
                uVar45 = 0;
                for (; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x80000000) {
                  uVar45 = uVar45 + 1;
                }
                do {
                  uVar46 = CONCAT44(0,uVar45);
                  uVar45 = *(uint *)((long)&local_10e0 + uVar46 * 4);
                  pGVar10 = (pSVar4->geometries).items[uVar45].ptr;
                  if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                    *(undefined4 *)(local_1540 + uVar46 * 4) = 0;
                  }
                  else {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      uVar124 = *(undefined4 *)(local_1340 + uVar46 * 4);
                      uVar2 = *(undefined4 *)(local_1320 + uVar46 * 4);
                      *(float *)(ray + k * 4 + 0x100) = local_12e0[uVar46 - 8];
                      *(float *)(ray + k * 4 + 0x180) = local_12e0[uVar46];
                      *(float *)(ray + k * 4 + 0x1a0) = local_12c0[uVar46];
                      *(float *)(ray + k * 4 + 0x1c0) = local_12a0[uVar46];
                      *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar124;
                      *(undefined4 *)(ray + k * 4 + 0x200) = uVar2;
                      *(undefined4 *)(ray + k * 4 + 0x220) =
                           *(undefined4 *)((long)&local_1440 + uVar46 * 4);
                      *(uint *)(ray + k * 4 + 0x240) = uVar45;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      break;
                    }
                    uVar124 = *(undefined4 *)(local_1340 + uVar46 * 4);
                    local_1060._4_4_ = uVar124;
                    local_1060._0_4_ = uVar124;
                    local_1060._8_4_ = uVar124;
                    local_1060._12_4_ = uVar124;
                    local_1060._16_4_ = uVar124;
                    local_1060._20_4_ = uVar124;
                    local_1060._24_4_ = uVar124;
                    local_1060._28_4_ = uVar124;
                    local_1040 = *(undefined4 *)(local_1320 + uVar46 * 4);
                    uVar124 = *(undefined4 *)((long)&local_1440 + uVar46 * 4);
                    local_1020._4_4_ = uVar124;
                    local_1020._0_4_ = uVar124;
                    local_1020._8_4_ = uVar124;
                    local_1020._12_4_ = uVar124;
                    local_1020._16_4_ = uVar124;
                    local_1020._20_4_ = uVar124;
                    local_1020._24_4_ = uVar124;
                    local_1020._28_4_ = uVar124;
                    fVar113 = local_12e0[uVar46];
                    fVar116 = local_12c0[uVar46];
                    local_10a0._4_4_ = fVar116;
                    local_10a0._0_4_ = fVar116;
                    local_10a0._8_4_ = fVar116;
                    local_10a0._12_4_ = fVar116;
                    local_10a0._16_4_ = fVar116;
                    local_10a0._20_4_ = fVar116;
                    local_10a0._24_4_ = fVar116;
                    local_10a0._28_4_ = fVar116;
                    fVar116 = local_12a0[uVar46];
                    local_1080._4_4_ = fVar116;
                    local_1080._0_4_ = fVar116;
                    local_1080._8_4_ = fVar116;
                    local_1080._12_4_ = fVar116;
                    local_1080._16_4_ = fVar116;
                    local_1080._20_4_ = fVar116;
                    local_1080._24_4_ = fVar116;
                    local_1080._28_4_ = fVar116;
                    auVar71._4_4_ = uVar45;
                    auVar71._0_4_ = uVar45;
                    auVar71._8_4_ = uVar45;
                    auVar71._12_4_ = uVar45;
                    auVar75._16_4_ = uVar45;
                    auVar75._0_16_ = auVar71;
                    auVar75._20_4_ = uVar45;
                    auVar75._24_4_ = uVar45;
                    auVar75._28_4_ = uVar45;
                    local_10c0[0] = (RTCHitN)SUB41(fVar113,0);
                    local_10c0[1] = (RTCHitN)(char)((uint)fVar113 >> 8);
                    local_10c0[2] = (RTCHitN)(char)((uint)fVar113 >> 0x10);
                    local_10c0[3] = (RTCHitN)(char)((uint)fVar113 >> 0x18);
                    local_10c0[4] = (RTCHitN)SUB41(fVar113,0);
                    local_10c0[5] = (RTCHitN)(char)((uint)fVar113 >> 8);
                    local_10c0[6] = (RTCHitN)(char)((uint)fVar113 >> 0x10);
                    local_10c0[7] = (RTCHitN)(char)((uint)fVar113 >> 0x18);
                    local_10c0[8] = (RTCHitN)SUB41(fVar113,0);
                    local_10c0[9] = (RTCHitN)(char)((uint)fVar113 >> 8);
                    local_10c0[10] = (RTCHitN)(char)((uint)fVar113 >> 0x10);
                    local_10c0[0xb] = (RTCHitN)(char)((uint)fVar113 >> 0x18);
                    local_10c0[0xc] = (RTCHitN)SUB41(fVar113,0);
                    local_10c0[0xd] = (RTCHitN)(char)((uint)fVar113 >> 8);
                    local_10c0[0xe] = (RTCHitN)(char)((uint)fVar113 >> 0x10);
                    local_10c0[0xf] = (RTCHitN)(char)((uint)fVar113 >> 0x18);
                    local_10c0[0x10] = (RTCHitN)SUB41(fVar113,0);
                    local_10c0[0x11] = (RTCHitN)(char)((uint)fVar113 >> 8);
                    local_10c0[0x12] = (RTCHitN)(char)((uint)fVar113 >> 0x10);
                    local_10c0[0x13] = (RTCHitN)(char)((uint)fVar113 >> 0x18);
                    local_10c0[0x14] = (RTCHitN)SUB41(fVar113,0);
                    local_10c0[0x15] = (RTCHitN)(char)((uint)fVar113 >> 8);
                    local_10c0[0x16] = (RTCHitN)(char)((uint)fVar113 >> 0x10);
                    local_10c0[0x17] = (RTCHitN)(char)((uint)fVar113 >> 0x18);
                    local_10c0[0x18] = (RTCHitN)SUB41(fVar113,0);
                    local_10c0[0x19] = (RTCHitN)(char)((uint)fVar113 >> 8);
                    local_10c0[0x1a] = (RTCHitN)(char)((uint)fVar113 >> 0x10);
                    local_10c0[0x1b] = (RTCHitN)(char)((uint)fVar113 >> 0x18);
                    local_10c0[0x1c] = (RTCHitN)SUB41(fVar113,0);
                    local_10c0[0x1d] = (RTCHitN)(char)((uint)fVar113 >> 8);
                    local_10c0[0x1e] = (RTCHitN)(char)((uint)fVar113 >> 0x10);
                    local_10c0[0x1f] = (RTCHitN)(char)((uint)fVar113 >> 0x18);
                    uStack_103c = local_1040;
                    uStack_1038 = local_1040;
                    uStack_1034 = local_1040;
                    uStack_1030 = local_1040;
                    uStack_102c = local_1040;
                    uStack_1028 = local_1040;
                    uStack_1024 = local_1040;
                    local_1000 = auVar75;
                    vpcmpeqd_avx2(local_1060,local_1060);
                    uStack_fdc = context->user->instID[0];
                    local_fe0 = uStack_fdc;
                    uStack_fd8 = uStack_fdc;
                    uStack_fd4 = uStack_fdc;
                    uStack_fd0 = uStack_fdc;
                    uStack_fcc = uStack_fdc;
                    uStack_fc8 = uStack_fdc;
                    uStack_fc4 = uStack_fdc;
                    uStack_fbc = context->user->instPrimID[0];
                    local_fc0 = uStack_fbc;
                    uStack_fb8 = uStack_fbc;
                    uStack_fb4 = uStack_fbc;
                    uStack_fb0 = uStack_fbc;
                    uStack_fac = uStack_fbc;
                    uStack_fa8 = uStack_fbc;
                    uStack_fa4 = uStack_fbc;
                    *(float *)(ray + k * 4 + 0x100) = local_12e0[uVar46 - 8];
                    local_1500 = local_1260;
                    local_15d0.valid = (int *)local_1500;
                    local_15d0.geometryUserPtr = pGVar10->userPtr;
                    local_15d0.context = context->user;
                    local_15d0.hit = local_10c0;
                    local_15d0.N = 8;
                    local_15d0.ray = (RTCRayN *)ray;
                    if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      local_1560 = auVar99._0_32_;
                      local_1580 = auVar55._0_32_;
                      local_15a0._0_8_ = uVar46;
                      auVar75 = ZEXT1632(auVar71);
                      (*pGVar10->intersectionFilterN)(&local_15d0);
                      auVar55 = ZEXT3264(local_1580);
                      auVar99 = ZEXT3264(local_1560);
                      uVar46 = local_15a0._0_8_;
                    }
                    auVar59 = vpcmpeqd_avx2(local_1500,_DAT_01faff00);
                    auVar64 = vpcmpeqd_avx2(auVar75,auVar75);
                    auVar58 = auVar64 & ~auVar59;
                    if ((((((((auVar58 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar58 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar58 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar58 >> 0x7f,0) == '\0') &&
                          (auVar58 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar58 >> 0xbf,0) == '\0') &&
                        (auVar58 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar58[0x1f]) {
                      auVar59 = auVar59 ^ auVar64;
                    }
                    else {
                      p_Var11 = context->args->filter;
                      if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                        local_1560 = auVar99._0_32_;
                        local_1580 = auVar55._0_32_;
                        local_15a0._0_8_ = uVar46;
                        auVar64 = ZEXT1632(auVar64._0_16_);
                        (*p_Var11)(&local_15d0);
                        auVar55 = ZEXT3264(local_1580);
                        auVar99 = ZEXT3264(local_1560);
                        uVar46 = local_15a0._0_8_;
                      }
                      auVar86 = vpcmpeqd_avx2(local_1500,_DAT_01faff00);
                      auVar64 = vpcmpeqd_avx2(auVar64,auVar64);
                      auVar59 = auVar86 ^ auVar64;
                      auVar58 = auVar64 & ~auVar86;
                      if ((((((((auVar58 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar58 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar58 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar58 >> 0x7f,0) != '\0') ||
                            (auVar58 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar58 >> 0xbf,0) != '\0') ||
                          (auVar58 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar58[0x1f] < '\0') {
                        auVar66._0_4_ = auVar86._0_4_ ^ auVar64._0_4_;
                        auVar66._4_4_ = auVar86._4_4_ ^ auVar64._4_4_;
                        auVar66._8_4_ = auVar86._8_4_ ^ auVar64._8_4_;
                        auVar66._12_4_ = auVar86._12_4_ ^ auVar64._12_4_;
                        auVar66._16_4_ = auVar86._16_4_ ^ auVar64._16_4_;
                        auVar66._20_4_ = auVar86._20_4_ ^ auVar64._20_4_;
                        auVar66._24_4_ = auVar86._24_4_ ^ auVar64._24_4_;
                        auVar66._28_4_ = auVar86._28_4_ ^ auVar64._28_4_;
                        auVar58 = vmaskmovps_avx(auVar66,*(undefined1 (*) [32])local_15d0.hit);
                        *(undefined1 (*) [32])(local_15d0.ray + 0x180) = auVar58;
                        auVar58 = vmaskmovps_avx(auVar66,*(undefined1 (*) [32])
                                                          (local_15d0.hit + 0x20));
                        *(undefined1 (*) [32])(local_15d0.ray + 0x1a0) = auVar58;
                        auVar58 = vmaskmovps_avx(auVar66,*(undefined1 (*) [32])
                                                          (local_15d0.hit + 0x40));
                        *(undefined1 (*) [32])(local_15d0.ray + 0x1c0) = auVar58;
                        auVar58 = vmaskmovps_avx(auVar66,*(undefined1 (*) [32])
                                                          (local_15d0.hit + 0x60));
                        *(undefined1 (*) [32])(local_15d0.ray + 0x1e0) = auVar58;
                        auVar58 = vmaskmovps_avx(auVar66,*(undefined1 (*) [32])
                                                          (local_15d0.hit + 0x80));
                        *(undefined1 (*) [32])(local_15d0.ray + 0x200) = auVar58;
                        auVar58 = vpmaskmovd_avx2(auVar66,*(undefined1 (*) [32])
                                                           (local_15d0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_15d0.ray + 0x220) = auVar58;
                        auVar58 = vpmaskmovd_avx2(auVar66,*(undefined1 (*) [32])
                                                           (local_15d0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_15d0.ray + 0x240) = auVar58;
                        auVar58 = vpmaskmovd_avx2(auVar66,*(undefined1 (*) [32])
                                                           (local_15d0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_15d0.ray + 0x260) = auVar58;
                        auVar58 = vpmaskmovd_avx2(auVar66,*(undefined1 (*) [32])
                                                           (local_15d0.hit + 0x100));
                        *(undefined1 (*) [32])(local_15d0.ray + 0x280) = auVar58;
                      }
                    }
                    if ((((((((auVar59 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar59 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar59 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar59 >> 0x7f,0) == '\0') &&
                          (auVar59 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar59 >> 0xbf,0) == '\0') &&
                        (auVar59 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar59[0x1f]) {
                      *(int *)(ray + k * 4 + 0x100) = auVar55._0_4_;
                    }
                    else {
                      auVar55 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                    }
                    *(undefined4 *)(local_1540 + uVar46 * 4) = 0;
                    uVar124 = auVar55._0_4_;
                    auVar54._4_4_ = uVar124;
                    auVar54._0_4_ = uVar124;
                    auVar54._8_4_ = uVar124;
                    auVar54._12_4_ = uVar124;
                    auVar54._16_4_ = uVar124;
                    auVar54._20_4_ = uVar124;
                    auVar54._24_4_ = uVar124;
                    auVar54._28_4_ = uVar124;
                    auVar58 = vcmpps_avx(auVar99._0_32_,auVar54,2);
                    local_1540 = vandps_avx(auVar58,local_1540);
                  }
                  if ((((((((local_1540 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_1540 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_1540 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_1540 >> 0x7f,0) == '\0') &&
                        (local_1540 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_1540 >> 0xbf,0) == '\0') &&
                      (local_1540 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_1540[0x1f]) break;
                  auVar65._8_4_ = 0x7f800000;
                  auVar65._0_8_ = 0x7f8000007f800000;
                  auVar65._12_4_ = 0x7f800000;
                  auVar65._16_4_ = 0x7f800000;
                  auVar65._20_4_ = 0x7f800000;
                  auVar65._24_4_ = 0x7f800000;
                  auVar65._28_4_ = 0x7f800000;
                  auVar58 = vblendvps_avx(auVar65,auVar99._0_32_,local_1540);
                  auVar59 = vshufps_avx(auVar58,auVar58,0xb1);
                  auVar59 = vminps_avx(auVar58,auVar59);
                  auVar64 = vshufpd_avx(auVar59,auVar59,5);
                  auVar59 = vminps_avx(auVar59,auVar64);
                  auVar64 = vpermpd_avx2(auVar59,0x4e);
                  auVar59 = vminps_avx(auVar59,auVar64);
                  auVar59 = vcmpps_avx(auVar58,auVar59,0);
                  auVar64 = local_1540 & auVar59;
                  auVar58 = local_1540;
                  if ((((((((auVar64 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar64 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar64 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar64 >> 0x7f,0) != '\0') ||
                        (auVar64 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar64 >> 0xbf,0) != '\0') ||
                      (auVar64 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar64[0x1f] < '\0') {
                    auVar58 = vandps_avx(auVar59,local_1540);
                  }
                  uVar40 = vmovmskps_avx(auVar58);
                  uVar45 = 0;
                  for (; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x80000000) {
                    uVar45 = uVar45 + 1;
                  }
                } while( true );
              }
            }
          }
          lVar43 = lVar43 + 1;
        } while (lVar43 != uVar44 - 8);
      }
      uVar124 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar55 = ZEXT1664(CONCAT412(uVar124,CONCAT48(uVar124,CONCAT44(uVar124,uVar124))));
      auVar100 = ZEXT1664(local_1450);
      auVar103 = ZEXT1664(local_1460);
      auVar112 = ZEXT1664(local_1470);
      auVar99 = ZEXT1664(local_1510);
      fVar113 = local_1480;
      fVar116 = fStack_147c;
      fVar117 = fStack_1478;
      fVar118 = fStack_1474;
      fVar119 = local_1490;
      fVar122 = fStack_148c;
      fVar123 = fStack_1488;
      fVar88 = fStack_1484;
      fVar101 = local_14a0;
      fVar93 = fStack_149c;
      fVar94 = fStack_1498;
      fVar95 = fStack_1494;
      fVar96 = local_14b0;
      fVar97 = fStack_14ac;
      fVar127 = fStack_14a8;
      fVar128 = fStack_14a4;
      fVar129 = local_14c0;
      fVar131 = fStack_14bc;
      fVar132 = fStack_14b8;
      fVar133 = fStack_14b4;
      fVar134 = local_14d0;
      fVar136 = fStack_14cc;
      fVar137 = fStack_14c8;
      fVar138 = fStack_14c4;
    }
    if (pauVar41 == (undefined1 (*) [16])&local_fa0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }